

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::Export_MetadataInteger
          (X3DExporter *this,aiString *pKey,int32_t pValue,size_t pTabLevel)

{
  pointer pcVar1;
  X3DExporter *this_00;
  uint uVar2;
  _Node *p_Var3;
  uint uVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator local_91;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_90;
  undefined1 local_78 [32];
  _Alloc_hider local_58 [2];
  char local_48 [16];
  X3DExporter *local_38;
  
  local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
  local_90._M_impl._M_node._M_size = 0;
  pcVar1 = local_78 + 0x10;
  local_90._M_impl._M_node.super__List_node_base._M_prev =
       local_90._M_impl._M_node.super__List_node_base._M_next;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"name","");
  std::__cxx11::string::string((string *)local_58,pKey->data,&local_91);
  p_Var3 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_90,(SAttribute *)local_78);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
  if (local_58[0]._M_p != local_48) {
    operator_delete(local_58[0]._M_p);
  }
  local_38 = this;
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_);
  }
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"value","");
  __val = -pValue;
  if (0 < pValue) {
    __val = pValue;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_006b5198;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_006b5198;
      }
      if (uVar4 < 10000) goto LAB_006b5198;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_006b5198:
  local_58[0]._M_p = local_48;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)(pValue >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_58[0]._M_p + ((uint)pValue >> 0x1f),__len,__val);
  p_Var3 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_90,(SAttribute *)local_78);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
  if (local_58[0]._M_p != local_48) {
    operator_delete(local_58[0]._M_p);
  }
  this_00 = local_38;
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_);
  }
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"MetadataInteger","");
  NodeHelper_OpenNode(this_00,(string *)local_78,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_90);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_90);
  return;
}

Assistant:

void X3DExporter::Export_MetadataInteger(const aiString& pKey, const int32_t pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", to_string(pValue)});
	NodeHelper_OpenNode("MetadataInteger", pTabLevel, true, attr_list);
}